

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  u8 enc;
  short sVar1;
  DbFixer *pDVar2;
  Parse *pPVar3;
  Parse *pPVar4;
  AggInfo *pAVar5;
  ExprList *pEVar6;
  byte bVar7;
  int iVar8;
  AggInfo_col *pAVar9;
  AggInfo_func *pAVar10;
  FuncDef *pFVar11;
  Table **ppTVar12;
  int iVar13;
  Expr *pEVar14;
  ExprList_item *pEVar15;
  i16 *in_R8;
  ulong uVar16;
  uint uVar17;
  int i_1;
  int i;
  int local_38;
  int local_34;
  
  pDVar2 = (pWalker->u).pFix;
  pPVar3 = pDVar2->pParse;
  pPVar4 = (pDVar2->w).pParse;
  pAVar5 = (AggInfo *)(pDVar2->w).xExprCallback;
  bVar7 = pExpr->op;
  if (bVar7 < 0xa9) {
    if (bVar7 != 0xa7) {
      if (bVar7 != 0xa8) {
        return 0;
      }
      if (((pDVar2->w).walkerDepth & 0x20000) != 0) {
        return 0;
      }
      if (pWalker->walkerDepth != (uint)pExpr->op2) {
        return 0;
      }
      iVar13 = pAVar5->nFunc;
      uVar16 = 0;
      if (0 < iVar13) {
        pAVar10 = pAVar5->aFunc;
        pEVar14 = pAVar10->pFExpr;
        if (pEVar14 != pExpr) {
          uVar17 = 0;
          do {
            pAVar10 = pAVar10 + 1;
            iVar8 = sqlite3ExprCompare((Parse *)0x0,pEVar14,pExpr,-1);
            iVar13 = pAVar5->nFunc;
            if (iVar8 == 0) {
              uVar16 = (ulong)uVar17;
              break;
            }
            uVar16 = (ulong)(uVar17 + 1);
            if (iVar13 <= (int)(uVar17 + 1)) break;
            pEVar14 = pAVar10->pFExpr;
            uVar17 = uVar17 + 1;
          } while (pEVar14 != pExpr);
        }
      }
      if (iVar13 <= (int)uVar16) {
        enc = pPVar3->db->enc;
        pAVar10 = (AggInfo_func *)
                  sqlite3ArrayAllocate
                            (pPVar3->db,pAVar5->aFunc,(int)&pAVar5->nFunc,&local_34,(int *)in_R8);
        pAVar5->aFunc = pAVar10;
        uVar16 = (ulong)local_34;
        if (-1 < (long)uVar16) {
          pAVar10[uVar16].pFExpr = pExpr;
          iVar13 = pPVar3->nMem + 1;
          pPVar3->nMem = iVar13;
          pAVar10[uVar16].iMem = iVar13;
          if ((pExpr->x).pList == (ExprList *)0x0) {
            iVar13 = 0;
          }
          else {
            iVar13 = ((pExpr->x).pList)->nExpr;
          }
          pFVar11 = sqlite3FindFunction(pPVar3->db,(pExpr->u).zToken,iVar13,enc,'\0');
          pAVar10[uVar16].pFunc = pFVar11;
          iVar13 = -1;
          if ((pExpr->flags & 4) != 0) {
            iVar13 = pPVar3->nTab;
            pPVar3->nTab = iVar13 + 1;
          }
          pAVar10[uVar16].iDistinct = iVar13;
        }
      }
      pExpr->iAgg = (i16)uVar16;
      pExpr->pAggInfo = pAVar5;
      return 1;
    }
  }
  else if ((bVar7 != 0xb3) && (bVar7 != 0xa9)) {
    return 0;
  }
  if (pPVar4 == (Parse *)0x0) {
    return 1;
  }
  iVar13 = *(int *)&pPVar4->db;
  if (iVar13 < 1) {
    return 1;
  }
  ppTVar12 = (Table **)&pPVar4->nLabelAlloc;
  while (pExpr->iTable != *(int *)ppTVar12) {
    ppTVar12 = ppTVar12 + 0xd;
    iVar13 = iVar13 + -1;
    if (iVar13 == 0) {
      return 1;
    }
  }
  if (0 < pAVar5->nColumn) {
    in_R8 = &pAVar5->aCol->iColumn;
    uVar16 = 0;
    do {
      if ((*(int *)(in_R8 + -4) == pExpr->iTable) && (*in_R8 == pExpr->iColumn && bVar7 != 0xb3))
      goto LAB_001aba1b;
      uVar17 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar17;
      in_R8 = in_R8 + 0x10;
    } while (pAVar5->nColumn != uVar17);
  }
  pAVar9 = (AggInfo_col *)
           sqlite3ArrayAllocate(pPVar3->db,pAVar5->aCol,(int)pAVar5 + 0x28,&local_38,(int *)in_R8);
  pAVar5->aCol = pAVar9;
  uVar16 = (ulong)local_38;
  if (-1 < (long)uVar16) {
    *(anon_union_8_3_c79b3df9_for_y *)(pAVar9 + uVar16) = pExpr->y;
    iVar13 = pExpr->iTable;
    pAVar9[uVar16].iTable = iVar13;
    sVar1 = pExpr->iColumn;
    pAVar9[uVar16].iColumn = sVar1;
    iVar8 = pPVar3->nMem + 1;
    pPVar3->nMem = iVar8;
    pAVar9[uVar16].iMem = iVar8;
    pAVar9[uVar16].pCExpr = pExpr;
    pEVar6 = pAVar5->pGroupBy;
    if (((pEVar6 != (ExprList *)0x0) && (pExpr->op != 0xb3)) && (0 < pEVar6->nExpr)) {
      pEVar15 = pEVar6->a;
      iVar8 = 0;
      do {
        pEVar14 = pEVar15->pExpr;
        if (((pEVar14->op == 0xa7) && (pEVar14->iTable == iVar13)) && (pEVar14->iColumn == sVar1)) {
          pAVar9[uVar16].iSorterColumn = (short)iVar8;
          if (-1 < (short)iVar8) goto LAB_001aba19;
          break;
        }
        iVar8 = iVar8 + 1;
        pEVar15 = pEVar15 + 1;
      } while (pEVar6->nExpr != iVar8);
    }
    iVar13 = pAVar5->nSortingColumn;
    pAVar5->nSortingColumn = iVar13 + 1;
    pAVar9[uVar16].iSorterColumn = (i16)iVar13;
  }
LAB_001aba19:
  bVar7 = pExpr->op;
LAB_001aba1b:
  pExpr->pAggInfo = pAVar5;
  if (bVar7 == 0xa7) {
    pExpr->op = 0xa9;
  }
  pExpr->iAgg = (i16)uVar16;
  return 1;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->uNC.pAggInfo;

  assert( pNC->ncFlags & NC_UAggInfo );
  switch( pExpr->op ){
    case TK_IF_NULL_ROW:
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      testcase( pExpr->op==TK_IF_NULL_ROW );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        SrcItem *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable
               && pCol->iColumn==pExpr->iColumn
               && pExpr->op!=TK_IF_NULL_ROW
              ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0
            ){
              pCol = &pAggInfo->aCol[k];
              assert( ExprUseYTab(pExpr) );
              pCol->pTab = pExpr->y.pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pCExpr = pExpr;
              if( pAggInfo->pGroupBy && pExpr->op!=TK_IF_NULL_ROW ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN
                   && pE->iTable==pExpr->iTable
                   && pE->iColumn==pExpr->iColumn
                  ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetVVAProperty(pExpr, EP_NoReduce);
            pExpr->pAggInfo = pAggInfo;
            if( pExpr->op==TK_COLUMN ){
              pExpr->op = TK_AGG_COLUMN;
            }
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( pItem->pFExpr==pExpr ) break;
          if( sqlite3ExprCompare(0, pItem->pFExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pFExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( ExprUseUToken(pExpr) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken,
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}